

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveNonJSOps.cpp
# Opt level: O0

void __thiscall wasm::RemoveNonJSOpsPass::doWalkFunction(RemoveNonJSOpsPass *this,Function *func)

{
  bool bVar1;
  Function *local_18;
  Function *func_local;
  RemoveNonJSOpsPass *this_local;
  
  local_18 = func;
  func_local = (Function *)this;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->builder);
  if (!bVar1) {
    Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>::getModule
              (&(this->
                super_WalkerPass<wasm::PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>_>
                ).
                super_PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
                .
                super_Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
              );
    std::make_unique<wasm::Builder,wasm::Module&>((Module *)&stack0xffffffffffffffe0);
    std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator=
              (&this->builder,
               (unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_> *)
               &stack0xffffffffffffffe0);
    std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::~unique_ptr
              ((unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_> *)
               &stack0xffffffffffffffe0);
  }
  Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>::doWalkFunction
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>_>
              ).
              super_PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
              .
              super_Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
             ,local_18);
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    if (!builder) {
      builder = std::make_unique<Builder>(*getModule());
    }
    PostWalker<RemoveNonJSOpsPass>::doWalkFunction(func);
  }